

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O1

void ucnv_close_63(UConverter *converter)

{
  UConverterClose p_Var1;
  UErrorCode errorCode;
  UConverterToUnicodeArgs toUArgs;
  UErrorCode local_4c;
  UConverterFromUnicodeArgs local_48;
  
  local_4c = U_ZERO_ERROR;
  if (converter != (UConverter *)0x0) {
    if (converter->fromCharErrorBehaviour != UCNV_TO_U_CALLBACK_SUBSTITUTE_63) {
      local_48.target = (char *)0x0;
      local_48.targetLimit = (char *)0x0;
      local_48.source = (UChar *)0x0;
      local_48.sourceLimit = (UChar *)0x0;
      local_48.offsets = (int32_t *)0x0;
      local_48.size = 0x38;
      local_48.flush = '\x01';
      local_48._3_5_ = 0;
      local_4c = U_ZERO_ERROR;
      local_48.converter = converter;
      (*converter->fromCharErrorBehaviour)
                (converter->toUContext,(UConverterToUnicodeArgs *)&local_48,(char *)0x0,0,UCNV_CLOSE
                 ,&local_4c);
    }
    if (converter->fromUCharErrorBehaviour != UCNV_FROM_U_CALLBACK_SUBSTITUTE_63) {
      local_48.target = (char *)0x0;
      local_48.targetLimit = (char *)0x0;
      local_48.source = (UChar *)0x0;
      local_48.sourceLimit = (UChar *)0x0;
      local_48.offsets = (int32_t *)0x0;
      local_48.size = 0x38;
      local_48.flush = '\x01';
      local_48._3_5_ = 0;
      local_4c = U_ZERO_ERROR;
      local_48.converter = converter;
      (*converter->fromUCharErrorBehaviour)
                (converter->fromUContext,&local_48,(UChar *)0x0,0,0,UCNV_CLOSE,&local_4c);
    }
    p_Var1 = converter->sharedData->impl->close;
    if (p_Var1 != (UConverterClose)0x0) {
      (*p_Var1)(converter);
    }
    if ((UChar *)converter->subChars != converter->subUChars) {
      uprv_free_63(converter->subChars);
    }
    if (converter->sharedData->isReferenceCounted != '\0') {
      ucnv_unloadSharedDataIfReady_63(converter->sharedData);
    }
    if (converter->isCopyLocal == '\0') {
      uprv_free_63(converter);
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucnv_close (UConverter * converter)
{
    UErrorCode errorCode = U_ZERO_ERROR;

    UTRACE_ENTRY_OC(UTRACE_UCNV_CLOSE);

    if (converter == NULL)
    {
        UTRACE_EXIT();
        return;
    }

    UTRACE_DATA3(UTRACE_OPEN_CLOSE, "close converter %s at %p, isCopyLocal=%b",
        ucnv_getName(converter, &errorCode), converter, converter->isCopyLocal);

    /* In order to speed up the close, only call the callbacks when they have been changed.
    This performance check will only work when the callbacks are set within a shared library
    or from user code that statically links this code. */
    /* first, notify the callback functions that the converter is closed */
    if (converter->fromCharErrorBehaviour != UCNV_TO_U_DEFAULT_CALLBACK) {
        UConverterToUnicodeArgs toUArgs = {
            sizeof(UConverterToUnicodeArgs),
                TRUE,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL
        };

        toUArgs.converter = converter;
        errorCode = U_ZERO_ERROR;
        converter->fromCharErrorBehaviour(converter->toUContext, &toUArgs, NULL, 0, UCNV_CLOSE, &errorCode);
    }
    if (converter->fromUCharErrorBehaviour != UCNV_FROM_U_DEFAULT_CALLBACK) {
        UConverterFromUnicodeArgs fromUArgs = {
            sizeof(UConverterFromUnicodeArgs),
                TRUE,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL,
                NULL
        };
        fromUArgs.converter = converter;
        errorCode = U_ZERO_ERROR;
        converter->fromUCharErrorBehaviour(converter->fromUContext, &fromUArgs, NULL, 0, 0, UCNV_CLOSE, &errorCode);
    }

    if (converter->sharedData->impl->close != NULL) {
        converter->sharedData->impl->close(converter);
    }

    if (converter->subChars != (uint8_t *)converter->subUChars) {
        uprv_free(converter->subChars);
    }

    if (converter->sharedData->isReferenceCounted) {
        ucnv_unloadSharedDataIfReady(converter->sharedData);
    }

    if(!converter->isCopyLocal){
        uprv_free(converter);
    }

    UTRACE_EXIT();
}